

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

void get_msurf_descriptors
               (integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  ulong uVar1;
  pointer piVar2;
  ulong uVar3;
  long lVar4;
  
  piVar2 = (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl
      .super__Vector_impl_data._M_finish != piVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      get_msurf_descriptor(iimage,(interest_point *)((long)piVar2->descriptor + lVar4 + -0x14));
      piVar2 = (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x114;
      uVar1 = ((long)(interest_points->
                     super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar2 >> 2) * -0xed7303b5cc0ed73;
    } while (uVar3 <= uVar1 && uVar1 - uVar3 != 0);
  }
  return;
}

Assistant:

void get_msurf_descriptors(struct integral_image* iimage, std::vector<struct interest_point> *interest_points) {
    for (int i = 0; i < interest_points->size(); ++i) {
        get_msurf_descriptor(iimage, &interest_points->at(i));
	}
}